

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall pugi::xml_node::child(xml_node *this,char_t *name_)

{
  bool bVar1;
  char_t *iname;
  xml_node_struct *i;
  char_t *name__local;
  xml_node *this_local;
  
  if (this->_root == (xml_node_struct *)0x0) {
    xml_node((xml_node *)&this_local);
  }
  else {
    for (iname = (char_t *)this->_root->first_child; iname != (char_t *)0x0;
        iname = *(char_t **)(iname + 0x30)) {
      if ((*(char_t **)(iname + 8) != (char_t *)0x0) &&
         (bVar1 = impl::anon_unknown_0::strequal(name_,*(char_t **)(iname + 8)), bVar1)) {
        xml_node((xml_node *)&this_local,(xml_node_struct *)iname);
        return (xml_node)(xml_node_struct *)this_local;
      }
    }
    xml_node((xml_node *)&this_local);
  }
  return (xml_node)(xml_node_struct *)this_local;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::child(const char_t* name_) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
				return xml_node(i);
		}

		return xml_node();
	}